

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDepends.cxx
# Opt level: O2

bool __thiscall
cmDepends::CheckDependencies
          (cmDepends *this,istream *internalDepends,string *internalDependsFileName,
          DependencyMap *validDeps)

{
  bool bVar1;
  char cVar2;
  bool bVar3;
  istream *piVar4;
  mapped_type *this_00;
  bool bVar5;
  cmFileTime dependeeTime;
  cmFileTime dependerTime;
  string dependee;
  string depender;
  string line;
  cmAlphaNum local_b8;
  cmFileTime internalDependsTime;
  cmAlphaNum local_80;
  string local_50;
  
  internalDependsTime.Time = 0;
  bVar1 = cmFileTimeCache::Load(this->FileTimeCache,internalDependsFileName,&internalDependsTime);
  if (!bVar1) {
    return false;
  }
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  line.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::reserve((ulong)&line);
  depender._M_dataplus._M_p = (pointer)&depender.field_2;
  depender._M_string_length = 0;
  bVar1 = false;
  dependee._M_dataplus._M_p = (pointer)&dependee.field_2;
  dependee._M_string_length = 0;
  dependerTime.Time = 0;
  dependeeTime.Time = 0;
  depender.field_2._M_local_buf[0] = '\0';
  dependee.field_2._M_local_buf[0] = '\0';
  bVar5 = true;
  do {
    this_00 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)0x0;
LAB_0045c071:
    do {
      do {
        piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                           (internalDepends,(string *)&line);
        if (((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 5) != 0) {
          std::__cxx11::string::~string((string *)&dependee);
          std::__cxx11::string::~string((string *)&depender);
          std::__cxx11::string::~string((string *)&line);
          return bVar5;
        }
      } while ((line._M_string_length == 0) || (cVar2 = *line._M_dataplus._M_p, cVar2 == '#'));
      if (line._M_dataplus._M_p[line._M_string_length - 1] == '\r') {
        std::__cxx11::string::pop_back();
        if (line._M_string_length == 0) goto LAB_0045c071;
        cVar2 = *line._M_dataplus._M_p;
      }
      if (cVar2 != ' ') {
        std::__cxx11::string::_M_assign((string *)&depender);
        bVar1 = cmFileTimeCache::Load(this->FileTimeCache,&depender,&dependerTime);
        this_00 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                  ::operator[](validDeps,&depender);
        goto LAB_0045c071;
      }
      std::__cxx11::string::substr((ulong)&local_b8,(ulong)&line);
      std::__cxx11::string::operator=((string *)&dependee,(string *)&local_b8);
      std::__cxx11::string::~string((string *)&local_b8);
      if (this_00 !=
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)0x0) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(this_00,&dependee);
      }
      bVar3 = cmFileTimeCache::Load(this->FileTimeCache,&dependee,&dependeeTime);
      if (!bVar3) {
        if (this->Verbose != true) goto LAB_0045c309;
        local_b8.View_._M_len = 10;
        local_b8.View_._M_str = "Dependee \"";
        local_80.View_._M_len = dependee._M_string_length;
        local_80.View_._M_str = dependee._M_dataplus._M_p;
        cmStrCat<char[32],std::__cxx11::string,char[4]>
                  (&local_50,&local_b8,&local_80,(char (*) [32])"\" does not exist for depender \"",
                   &depender,(char (*) [4])0x640383);
        cmSystemTools::Stdout(&local_50);
        goto LAB_0045c301;
      }
      if (bVar1 == false) {
        if (internalDependsTime.Time < dependeeTime.Time) {
          if (this->Verbose != true) goto LAB_0045c309;
          local_b8.View_._M_len = 10;
          local_b8.View_._M_str = "Dependee \"";
          local_80.View_._M_len = dependee._M_string_length;
          local_80.View_._M_str = dependee._M_dataplus._M_p;
          cmStrCat<char[31],std::__cxx11::string,char[4]>
                    (&local_50,&local_b8,&local_80,(char (*) [31])"\" is newer than depends file \""
                     ,internalDependsFileName,(char (*) [4])0x640383);
          cmSystemTools::Stdout(&local_50);
          goto LAB_0045c301;
        }
        goto LAB_0045c071;
      }
    } while (dependeeTime.Time <= dependerTime.Time);
    if (this->Verbose == true) {
      local_b8.View_._M_len = 10;
      local_b8.View_._M_str = "Dependee \"";
      local_80.View_._M_len = dependee._M_string_length;
      local_80.View_._M_str = dependee._M_dataplus._M_p;
      cmStrCat<char[27],std::__cxx11::string,char[4]>
                (&local_50,&local_b8,&local_80,(char (*) [27])"\" is newer than depender \"",
                 &depender,(char (*) [4])0x640383);
      cmSystemTools::Stdout(&local_50);
LAB_0045c301:
      std::__cxx11::string::~string((string *)&local_50);
    }
LAB_0045c309:
    if (this_00 !=
        (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)0x0) {
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
      ::erase(&validDeps->_M_t,&depender);
    }
    bVar5 = false;
    if (bVar1 != false) {
      cmsys::SystemTools::RemoveFile(&depender);
      bVar5 = false;
      cmFileTimeCache::Remove(this->FileTimeCache,&depender);
      bVar1 = false;
    }
  } while( true );
}

Assistant:

bool cmDepends::CheckDependencies(std::istream& internalDepends,
                                  const std::string& internalDependsFileName,
                                  DependencyMap& validDeps)
{
  // Read internal depends file time
  cmFileTime internalDependsTime;
  if (!this->FileTimeCache->Load(internalDependsFileName,
                                 internalDependsTime)) {
    return false;
  }

  // Parse dependencies from the stream.  If any dependee is missing
  // or newer than the depender then dependencies should be
  // regenerated.
  bool okay = true;
  bool dependerExists = false;

  std::string line;
  line.reserve(1024);
  std::string depender;
  std::string dependee;
  cmFileTime dependerTime;
  cmFileTime dependeeTime;
  std::vector<std::string>* currentDependencies = nullptr;

  while (std::getline(internalDepends, line)) {
    // Check if this an empty or a comment line
    if (line.empty() || line.front() == '#') {
      continue;
    }
    // Drop carriage return character at the end
    if (line.back() == '\r') {
      line.pop_back();
      if (line.empty()) {
        continue;
      }
    }
    // Check if this a depender line
    if (line.front() != ' ') {
      depender = line;
      dependerExists = this->FileTimeCache->Load(depender, dependerTime);
      // If we erase validDeps[this->Depender] by overwriting it with an empty
      // vector, we lose dependencies for dependers that have multiple
      // entries. No need to initialize the entry, std::map will do so on first
      // access.
      currentDependencies = &validDeps[depender];
      continue;
    }

    // This is a dependee line
    dependee = line.substr(1);

    // Add dependee to depender's list
    if (currentDependencies != nullptr) {
      currentDependencies->push_back(dependee);
    }

    // Dependencies must be regenerated
    // * if the dependee does not exist
    // * if the depender exists and is older than the dependee.
    // * if the depender does not exist, but the dependee is newer than the
    //   depends file
    bool regenerate = false;
    bool dependeeExists = this->FileTimeCache->Load(dependee, dependeeTime);
    if (!dependeeExists) {
      // The dependee does not exist.
      regenerate = true;

      // Print verbose output.
      if (this->Verbose) {
        cmSystemTools::Stdout(cmStrCat("Dependee \"", dependee,
                                       "\" does not exist for depender \"",
                                       depender, "\".\n"));
      }
    } else if (dependerExists) {
      // The dependee and depender both exist.  Compare file times.
      if (dependerTime.Older(dependeeTime)) {
        // The depender is older than the dependee.
        regenerate = true;

        // Print verbose output.
        if (this->Verbose) {
          cmSystemTools::Stdout(cmStrCat("Dependee \"", dependee,
                                         "\" is newer than depender \"",
                                         depender, "\".\n"));
        }
      }
    } else {
      // The dependee exists, but the depender doesn't. Regenerate if the
      // internalDepends file is older than the dependee.
      if (internalDependsTime.Older(dependeeTime)) {
        // The depends-file is older than the dependee.
        regenerate = true;

        // Print verbose output.
        if (this->Verbose) {
          cmSystemTools::Stdout(cmStrCat("Dependee \"", dependee,
                                         "\" is newer than depends file \"",
                                         internalDependsFileName, "\".\n"));
        }
      }
    }

    if (regenerate) {
      // Dependencies must be regenerated.
      okay = false;

      // Remove the information of this depender from the map, it needs
      // to be rescanned
      if (currentDependencies != nullptr) {
        validDeps.erase(depender);
        currentDependencies = nullptr;
      }

      // Remove the depender to be sure it is rebuilt.
      if (dependerExists) {
        cmSystemTools::RemoveFile(depender);
        this->FileTimeCache->Remove(depender);
        dependerExists = false;
      }
    }
  }

  return okay;
}